

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrcmap.c
# Opt level: O1

FT_Error pfr_cmap_init(PFR_CMap cmap,FT_Pointer pointer)

{
  uint uVar1;
  FT_Face pFVar2;
  PFR_Char pPVar3;
  int iVar4;
  
  pFVar2 = (cmap->cmap).charmap.face;
  uVar1 = *(uint *)&pFVar2[2].generic.data;
  cmap->num_chars = uVar1;
  pPVar3 = (PFR_Char)pFVar2[2].bbox.xMin;
  cmap->chars = pPVar3;
  if (1 < uVar1) {
    iVar4 = uVar1 - 1;
    do {
      if (pPVar3[1].char_code <= pPVar3->char_code) {
        return 8;
      }
      iVar4 = iVar4 + -1;
      pPVar3 = pPVar3 + 1;
    } while (iVar4 != 0);
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  pfr_cmap_init( PFR_CMap    cmap,
                 FT_Pointer  pointer )
  {
    FT_Error  error = FT_Err_Ok;
    PFR_Face  face  = (PFR_Face)FT_CMAP_FACE( cmap );

    FT_UNUSED( pointer );


    cmap->num_chars = face->phy_font.num_chars;
    cmap->chars     = face->phy_font.chars;

    /* just for safety, check that the character entries are correctly */
    /* sorted in increasing character code order                       */
    {
      FT_UInt  n;


      for ( n = 1; n < cmap->num_chars; n++ )
      {
        if ( cmap->chars[n - 1].char_code >= cmap->chars[n].char_code )
        {
          error = FT_THROW( Invalid_Table );
          goto Exit;
        }
      }
    }

  Exit:
    return error;
  }